

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  bool local_16;
  bool local_15;
  LinkType local_14;
  cmComputeLinkInformation *pcStack_10;
  LinkType lt_local;
  cmComputeLinkInformation *this_local;
  
  if ((this->CurrentLinkType != lt) &&
     (this->CurrentLinkType = lt, (this->LinkTypeEnabled & 1U) != 0)) {
    local_14 = lt;
    pcStack_10 = this;
    if (this->CurrentLinkType == LinkStatic) {
      local_15 = false;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,bool>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&this->StaticLinkTypeFlag,&local_15);
    }
    else if (this->CurrentLinkType == LinkShared) {
      local_16 = false;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,bool>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&this->SharedLinkTypeFlag,&local_16);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.emplace_back(this->StaticLinkTypeFlag, false);
          break;
        case LinkShared:
          this->Items.emplace_back(this->SharedLinkTypeFlag, false);
          break;
        default:
          break;
      }
    }
  }
}